

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_luma_subsampling_420_hbd_c
               (uint16_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  int iVar1;
  long lVar2;
  
  for (iVar1 = 0; iVar1 < height; iVar1 = iVar1 + 2) {
    for (lVar2 = 0; lVar2 < width; lVar2 = lVar2 + 2) {
      *(uint16_t *)((long)output_q3 + lVar2) =
           (input[lVar2 + 1] + input[lVar2] + input[input_stride + lVar2] +
           input[(long)input_stride + lVar2 + 1]) * 2;
    }
    output_q3 = output_q3 + 0x20;
    input = input + input_stride * 2;
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_420_hbd_c(const uint16_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  for (int j = 0; j < height; j += 2) {
    for (int i = 0; i < width; i += 2) {
      const int bot = i + input_stride;
      output_q3[i >> 1] =
          (input[i] + input[i + 1] + input[bot] + input[bot + 1]) << 1;
    }
    input += input_stride << 1;
    output_q3 += CFL_BUF_LINE;
  }
}